

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O2

string<wchar_t> * __thiscall
irr::core::string<wchar_t>::subString
          (string<wchar_t> *__return_storage_ptr__,string<wchar_t> *this,u32 begin,s32 length,
          bool make_lower)

{
  wstring awStack_38 [32];
  
  if ((length < 1) || ((uint)(this->str)._M_string_length <= begin)) {
    string<char>(__return_storage_ptr__,"");
  }
  else {
    ::std::__cxx11::wstring::substr((ulong)awStack_38,(ulong)this);
    ::std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,awStack_38);
    ::std::__cxx11::wstring::_M_dispose();
    if (make_lower) {
      string<wchar_t>::make_lower(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string<T> subString(u32 begin, s32 length, bool make_lower = false) const
	{
		// if start after string
		// or no proper substring length
		if ((length <= 0) || (begin >= size()))
			return string<T>("");

		string<T> o = str.substr(begin, length);
		if (make_lower)
			o.make_lower();
		return o;
	}